

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMaterial.cpp
# Opt level: O2

void __thiscall Assimp::FBX::Texture::~Texture(Texture *this)

{
  ~Texture(this);
  operator_delete(this);
  return;
}

Assistant:

Texture::~Texture()
{

}